

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horn.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  byte *__s2;
  uint uVar3;
  int iVar4;
  ssize_t sVar5;
  ssize_t sVar6;
  ssize_t sVar7;
  ssize_t sVar8;
  ssize_t sVar9;
  ssize_t sVar10;
  uchar (*paauVar11) [675] [675];
  int int_size_y;
  int int_size_y_00;
  int int_size_y_01;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint end;
  uchar (*paauVar20) [675] [675];
  int iVar21;
  float (*__buf) [675] [2];
  float fVar22;
  float density;
  float st_dev;
  float ave_error;
  int middle;
  float tau;
  float sigma;
  ulong local_290;
  float max_angle;
  float min_angle;
  int numpass;
  char correct_filename [100];
  char full_name [100];
  uchar header [32];
  char path3 [100];
  char path2 [100];
  char path1 [100];
  
  if (argc - 0x14U < 0xfffffff3) {
    printf("Usage: %s <filename stem> <alpha> <sigma> <central file number> <number of iterations> <input path> <output path> [-S <smooth path> -C <full correct filename> -B <cols> <rows> -T <tau> -H or -MH]\n\n"
           ,*argv);
    puts("<filename stem> - stem of input filenames");
    puts("<alpha> - Lagrange multiplier value");
    puts("<sigma> - the standard deviation used in smoothing the files");
    puts("   sigma==0.0 means no smoothing: use 2 or 5 unsmoothed images");
    puts("<central file number> - the image file number for which");
    puts("   image velocity is to be computed");
    puts("<number of iterations> - number of iterations in the velocity calculation");
    puts("<input path> - directory where input data resides");
    puts("<output path> - directory where computed flow fields put");
    puts("-S <smooth path> - directory where smoothed data is to be put");
    puts("   if not present smoothed files are not written");
    puts("-B <cols> <rows> - use binary file of size <cols>*<rows> characters");
    puts("   instead of black and white rasterfiles as image input");
    puts("   image size read from rasterfile header if used");
    puts("-C <correct filename> - perform error analysis using correct velocity field");
    puts("-T <tau> - threshold the computed velocities on spatial intensity gradient");
    puts("-H Standard Horn and Schunck");
    puts("   perform H and S differencing on 2 input images");
    puts(" sigma is ignored for -H");
    puts("-MH Non-standard Horn and Schunck - default");
    pcVar14 = "    perform 4-point central differences on 5 input images";
    goto LAB_00102192;
  }
  puts("\n------------------------------");
  printf("Command line: ");
  uVar18 = 0;
  do {
    printf("%s ",argv[uVar18]);
    uVar18 = uVar18 + 1;
  } while ((uint)argc != uVar18);
  printf("\n%d arguments\n",(ulong)(argc - 1));
  __isoc99_sscanf(argv[2],"%f",&alpha);
  __isoc99_sscanf(argv[3],"%f",&sigma);
  __isoc99_sscanf(argv[4],"%d",&middle);
  __isoc99_sscanf(argv[5],"%d",&numpass);
  printf("alpha=%f\n",(double)alpha);
  printf("sigma=%f\n",(double)sigma);
  printf("Central image: %d\n",(ulong)(uint)middle);
  printf("Number of iterations: %d\n",(ulong)(uint)numpass);
  strcpy(path1,argv[6]);
  path2[0] = '.';
  path2[1] = '\0';
  strcpy(path3,argv[7]);
  printf("Input directory: %s\n",path1);
  printf("Output directory: %s\n",path3);
  BINARY = 0;
  STANDARD = 0;
  THRESHOLD = 0;
  WRITE_SMOOTH = 0;
  builtin_strncpy(correct_filename,"unknown",8);
  if (argc < 9) {
LAB_001015ca:
    puts("Smoothed images not written");
  }
  else {
    uVar18 = 8;
    do {
      iVar12 = (int)uVar18;
      __s2 = (byte *)argv[iVar12];
      bVar1 = *__s2;
      iVar21 = -(bVar1 - 0x2d);
      iVar4 = iVar21;
      if (bVar1 == 0x2d) {
        uVar3 = __s2[1] - 0x48;
        if (uVar3 == 0) {
          uVar3 = (uint)__s2[2];
        }
        iVar4 = -uVar3;
      }
      if (iVar4 == 0) {
        STANDARD = 1;
        uVar18 = (ulong)(iVar12 + 1);
      }
      else {
        iVar4 = strcmp("-MH",(char *)__s2);
        if (iVar4 == 0) {
          STANDARD = 0;
          uVar18 = (ulong)(iVar12 + 1);
        }
        else {
          iVar4 = iVar21;
          if (bVar1 == 0x2d) {
            uVar3 = __s2[1] - 0x43;
            if (uVar3 == 0) {
              uVar3 = (uint)__s2[2];
            }
            if (uVar3 != 0) {
              uVar3 = __s2[1] - 0x54;
              if (uVar3 == 0) {
                uVar3 = (uint)__s2[2];
              }
              iVar4 = -uVar3;
              goto LAB_0010149a;
            }
            strcpy(correct_filename,argv[(long)iVar12 + 1]);
LAB_00101599:
            uVar18 = (ulong)(iVar12 + 2);
          }
          else {
LAB_0010149a:
            if (iVar4 == 0) {
              __isoc99_sscanf(argv[(long)iVar12 + 1],"%f",&tau);
              uVar18 = (ulong)(iVar12 + 2);
              THRESHOLD = 1;
            }
            else {
              if (bVar1 == 0x2d) {
                uVar3 = __s2[1] - 0x53;
                if (uVar3 == 0) {
                  uVar3 = (uint)__s2[2];
                }
                if (uVar3 == 0) {
                  strcpy(path2,argv[(long)iVar12 + 1]);
                  WRITE_SMOOTH = 1;
                  goto LAB_00101599;
                }
                uVar3 = __s2[1] - 0x42;
                if (uVar3 == 0) {
                  uVar3 = (uint)__s2[2];
                }
                iVar21 = -uVar3;
              }
              if (iVar21 != 0) {
                printf("Invalid option %s specified as argument %d -  program terminates\n",__s2,
                       uVar18);
                goto LAB_00102197;
              }
              __isoc99_sscanf(argv[(long)iVar12 + 1],"%d",&pic_y);
              __isoc99_sscanf(argv[(long)iVar12 + 2],"%d",&pic_x);
              BINARY = 1;
              uVar18 = (ulong)(iVar12 + 3);
            }
          }
        }
      }
    } while ((int)uVar18 < argc);
    if (WRITE_SMOOTH == 0) goto LAB_001015ca;
    printf("Smoothed data directory: %s\n",path2);
  }
  fflush(_stdout);
  printf("Correct velocity file: %s\n");
  fflush(_stdout);
  if (correct_filename._0_8_ != 0x6e776f6e6b6e75) {
    uVar3 = open(correct_filename,0);
    if ((int)uVar3 < 1) {
      printf("Fatal error in opening file %s\n",correct_filename);
      printf("fd_correct: %d\n",(ulong)uVar3);
      goto LAB_00102197;
    }
    sVar5 = read(uVar3,&actual_y,4);
    sVar6 = read(uVar3,&actual_x,4);
    sVar7 = read(uVar3,&size_y,4);
    sVar8 = read(uVar3,&size_x,4);
    sVar9 = read(uVar3,&offset_y,4);
    sVar10 = read(uVar3,&offset_x,4);
    if ((((offset_x == 0.0) && (!NAN(offset_x))) && (offset_y == 0.0)) && (!NAN(offset_y))) {
      if ((actual_x == size_x) && (!NAN(actual_x) && !NAN(size_x))) {
        if ((actual_y == size_y) && (!NAN(actual_y) && !NAN(size_y))) {
          uVar18 = sVar9 + sVar10 + sVar7 + sVar8 + sVar6 + sVar5;
          ::int_size_y = (int)size_y;
          int_size_x = (int)size_x;
          if (0 < int_size_x) {
            __buf = correct_vels;
            lVar19 = 0;
            do {
              sVar5 = read(uVar3,__buf,(long)::int_size_y << 3);
              uVar18 = (int)uVar18 + sVar5;
              lVar19 = lVar19 + 1;
              __buf = __buf + 1;
            } while (lVar19 < int_size_x);
          }
          printf("\nFile %s opened and read\n",correct_filename);
          printf("Size of correct velocity data: %d %d\n",(ulong)(uint)::int_size_y,
                 (ulong)(uint)int_size_x);
          printf("%d bytes read\n",uVar18 & 0xffffffff);
          fflush(_stdout);
          goto LAB_001017d1;
        }
      }
    }
    puts("Fatal error: something wrong with correct velocity data");
    printf("Actual y: %f Actual x: %f\n",(double)actual_y,(double)actual_x);
    printf("Size y: %f Size x: %f\n",(double)size_y,(double)size_x);
    printf("Offset y: %f Offset x: %f\n",(double)offset_y,(double)offset_x);
    goto LAB_00102197;
  }
LAB_001017d1:
  if (STANDARD == 0) {
    uVar3 = (uint)(sigma * 6.0 + 1.0);
    uVar13 = uVar3 | 1;
    iVar4 = (int)(uVar13 - ((int)uVar3 >> 0x1f)) >> 1;
    uVar3 = iVar4 + 2;
    local_290 = (ulong)uVar3;
    end = iVar4 + middle + 2;
    uVar3 = middle - uVar3;
    printf("Size: %d Offset: %d Start: %d End: %d\n",(ulong)uVar13,local_290,(ulong)uVar3,(ulong)end
          );
    printf("%d images required\n",(ulong)((end - uVar3) + 1));
    if ((int)(end - uVar3) < 0xf) {
      if ((int)uVar3 <= (int)end) {
        read_and_smooth3D(path1,argv[1],SUB84((double)sigma,0),floatpic,pic,inpic,uVar3,middle,end,
                          header);
        uVar16 = (ulong)(uint)pic_y;
        uVar18 = (ulong)(uint)pic_x;
        if (((sigma != 0.0) || (NAN(sigma))) && (WRITE_SMOOTH != 0)) {
          writefiles(path2,argv[1],pic,SUB84((double)sigma,0),middle + -2,pic_x,pic_y,middle + -2,
                     middle + 2,header);
          uVar16 = (ulong)(uint)pic_y;
          uVar18 = (ulong)(uint)pic_x;
        }
        goto LAB_00101a1f;
      }
      pcVar14 = "Fatal error: specify images in ascending order";
    }
    else {
      pcVar14 = "Fatal error: not enough room for the images";
    }
  }
  else {
    paauVar20 = inpic;
    readfiles(path1,argv[1],inpic,middle + 1,&pic_x,&pic_y,middle,middle + 1,header);
    iVar4 = pic_y;
    uVar18 = (ulong)pic_x;
    uVar16 = (ulong)(uint)pic_y;
    local_290 = 2;
    if (0 < (long)uVar18) {
      paauVar11 = pic;
      lVar19 = 0xb75bf0;
      uVar15 = 0;
      do {
        if (0 < iVar4) {
          uVar17 = 0;
          do {
            bVar1 = (*(uchar (*) [675])(*paauVar20)[0])[uVar17];
            (*(uchar (*) [675])(*paauVar11)[0])[uVar17] = bVar1;
            bVar2 = (*(uchar (*) [675] [675])((long)paauVar20 + 0x6f3c9))[0][uVar17];
            (*(uchar (*) [675] [675])((long)paauVar11 + 0x6f3c9))[0][uVar17] = bVar2;
            (*(uchar (*) [675] [675])((long)paauVar11 + 0xde792))[0][uVar17] = '\0';
            *(float *)(lVar19 + -0x6f3c90 + uVar17 * 4) = (float)bVar1;
            (*(uchar (*) [675] [675])((long)paauVar11 + 0x14db5b))[0][uVar17] = '\0';
            (*(uchar (*) [675] [675])((long)paauVar11 + 0x1bcf24))[0][uVar17] = '\0';
            *(float *)(lVar19 + -0x536d6c + uVar17 * 4) = (float)bVar2;
            *(undefined4 *)(lVar19 + -0x379e48 + uVar17 * 4) = 0;
            *(undefined4 *)(lVar19 + -0x1bcf24 + uVar17 * 4) = 0;
            *(undefined4 *)(lVar19 + uVar17 * 4) = 0;
            uVar17 = uVar17 + 1;
          } while (uVar16 != uVar17);
        }
        uVar15 = uVar15 + 1;
        paauVar20 = (uchar (*) [675] [675])((long)paauVar20 + 0x2a3);
        paauVar11 = (uchar (*) [675] [675])((long)paauVar11 + 0x2a3);
        lVar19 = lVar19 + 0xa8c;
      } while (uVar15 != uVar18);
    }
LAB_00101a1f:
    iVar4 = (int)uVar18;
    printf("Number of Columns: %d Number of Rows: %d\n",uVar16,uVar18 & 0xffffffff);
    if ((pic_x < 0x2a4) && (pic_y < 0x2a4)) {
      putchar(10);
      fflush(_stdout);
      if (STANDARD == 1) {
        if (THRESHOLD == 0) {
          pcVar14 = "%s/horn.original.%sF";
LAB_00101ad2:
          sprintf(full_name,pcVar14,path3,argv[1]);
          goto LAB_00101ae9;
        }
        pcVar14 = "%s/horn.original.%sF-%4.2f";
      }
      else {
        if (THRESHOLD == 0) {
          pcVar14 = "%s/horn.modified.%sF";
          goto LAB_00101ad2;
        }
        pcVar14 = "%s/horn.modified.%sF-%4.2f";
      }
      sprintf(full_name,pcVar14,(double)tau,path3,argv[1]);
LAB_00101ae9:
      printf("Output full velocities go to file %s\n",full_name);
      putchar(10);
      fflush(_stdout);
      startx = 2;
      starty = 2;
      endx = pic_x + -3;
      endy = pic_y + -3;
      step = 1;
      if (STANDARD == 0) {
        compute_ders(Ix,Iy,It,floatpic,iVar4,pic_x,pic_y,(int)local_290);
      }
      else {
        calcIx(Ix,floatpic,0);
        calcIy(Iy,floatpic,0);
        calcIt(It,floatpic,0);
      }
      memset(full_vels,0,0x379e48);
      memset(full_vels1,0,0x379e48);
      if (0 < numpass) {
        iVar4 = (int)local_290 * 2;
        uVar3 = 0;
        do {
          printf("%3dth iteration\n",(ulong)uVar3);
          fflush(_stdout);
          calc_vels(full_vels,full_vels1,Ix,Iy,It);
          fVar22 = difference(full_vels,full_vels1,pic_x,pic_y);
          printf("The improvement: %f\n",(double)fVar22);
          fflush(_stdout);
          if (correct_filename._0_8_ != 0x6e776f6e6b6e75) {
            iVar12 = 0x220e120;
            rearrange(full_vels1,temp_vels);
            calc_statistics(correct_vels,iVar12,int_size_y,temp_vels,pic_x,pic_y,iVar4,&ave_error,
                            &st_dev,&density,&min_angle,&max_angle);
            printf("Error: %f St Dev: %f Density: %f\n",(double)ave_error,(double)st_dev,
                   (double)density);
            fflush(_stdout);
          }
          printf("%3dth iteration\n",(ulong)(uVar3 + 1));
          calc_vels(full_vels1,full_vels,Ix,Iy,It);
          fVar22 = difference(full_vels,full_vels1,pic_x,pic_y);
          printf("The improvement: %f\n",(double)fVar22);
          if (correct_filename._0_8_ != 0x6e776f6e6b6e75) {
            iVar12 = 0x220e120;
            rearrange(full_vels,temp_vels);
            calc_statistics(correct_vels,iVar12,int_size_y_00,temp_vels,pic_x,pic_y,iVar4,&ave_error
                            ,&st_dev,&density,&min_angle,&max_angle);
            printf("Error: %f St Dev: %f Density: %f\n",(double)ave_error,(double)st_dev,
                   (double)density);
            fflush(_stdout);
          }
          uVar3 = uVar3 + 2;
        } while ((int)uVar3 < numpass);
      }
      if (THRESHOLD != 0) {
        threshold(full_vels,Ix,Iy,SUB84((double)tau,0),pic_x,pic_y);
      }
      iVar4 = creat(full_name,0x1a4);
      if (iVar4 < 1) {
        iVar12 = (int)full_name;
        printf("Error in opening %s file\n\n");
      }
      else {
        iVar12 = 0x10548c;
        output_velocities(iVar4,"Full",full_vels,pic_x,pic_y,(int)local_290 * 2);
      }
      puts("\nVelocities computed and output");
      fflush(_stdout);
      if (correct_filename._0_8_ != 0x6e776f6e6b6e75) {
        calc_statistics(correct_vels,iVar12,int_size_y_01,full_vels,pic_x,pic_y,(int)local_290 * 2,
                        &ave_error,&st_dev,&density,&min_angle,&max_angle);
        puts("\n\nComputed Statistics");
        printf("Error: %f St Dev: %f\n",(double)ave_error,(double)st_dev);
        printf("Density: %f\n",(double)density);
        printf("Minimum angle error: %f Maximum angle error: %f\n",(double)min_angle,
               (double)max_angle);
      }
      fflush(_stdout);
      return 0;
    }
    pcVar14 = "Fatal error: images are too big";
  }
LAB_00102192:
  puts(pcVar14);
LAB_00102197:
  exit(1);
}

Assistant:

int main(argc,argv)
int argc;
char **argv;
{
int fdf,offset,size,start,end,middle,i,j;
int fd_correct,no_bytes,numpass,time;
float ave_error,st_dev,density,min_angle,max_angle,sigma,tau;
unsigned char header[HEAD];
char path1[100],path2[100],path3[100];
char full_name[100],correct_filename[100];

if(argc < 7 || argc > 19)
	{
        printf("Usage: %s <filename stem> <alpha> <sigma> <central file number> <number of iterations> <input path> <output path> [-S <smooth path> -C <full correct filename> -B <cols> <rows> -T <tau> -H or -MH]\n\n",argv[0]);
	printf("<filename stem> - stem of input filenames\n");
	printf("<alpha> - Lagrange multiplier value\n");
	printf("<sigma> - the standard deviation used in smoothing the files\n");
	printf("   sigma==0.0 means no smoothing: use 2 or 5 unsmoothed images\n");
	printf("<central file number> - the image file number for which\n");
	printf("   image velocity is to be computed\n");
	printf("<number of iterations> - number of iterations in the velocity calculation\n");
	printf("<input path> - directory where input data resides\n");
	printf("<output path> - directory where computed flow fields put\n");
	printf("-S <smooth path> - directory where smoothed data is to be put\n");
	printf("   if not present smoothed files are not written\n");
	printf("-B <cols> <rows> - use binary file of size <cols>*<rows> characters\n");
	printf("   instead of black and white rasterfiles as image input\n");
	printf("   image size read from rasterfile header if used\n");
	printf("-C <correct filename> - perform error analysis using correct velocity field\n");
	printf("-T <tau> - threshold the computed velocities on spatial intensity gradient\n");
	printf("-H Standard Horn and Schunck\n");
	printf("   perform H and S differencing on 2 input images\n");
	printf(" sigma is ignored for -H\n");
	printf("-MH Non-standard Horn and Schunck - default\n");
	printf("    perform 4-point central differences on 5 input images\n");
	exit(1);
        }

printf("\n------------------------------\n");
printf("Command line: ");
for(i=0;i<argc;i++) printf("%s ",argv[i]);
printf("\n%d arguments\n",argc-1);

sscanf(argv[2],"%f",&alpha);
sscanf(argv[3],"%f",&sigma);
sscanf(argv[4],"%d",&middle);
sscanf(argv[5],"%d",&numpass);
printf("alpha=%f\n",alpha);
printf("sigma=%f\n",sigma);
printf("Central image: %d\n",middle);
printf("Number of iterations: %d\n",numpass);
strcpy(path1,argv[6]);
strcpy(path2,".");
strcpy(path3,argv[7]);

printf("Input directory: %s\n",path1);
printf("Output directory: %s\n",path3);

BINARY = FALSE;
STANDARD = FALSE;
THRESHOLD = FALSE;
WRITE_SMOOTH = FALSE;
i=8;
strcpy(correct_filename,"unknown");
while(i<argc)
{
if(strcmp("-H",argv[i])==0)
	{
	STANDARD = TRUE;
	i++;
	}
else
if(strcmp("-MH",argv[i])==0)
	{
	STANDARD = FALSE;
	i++;
	}
else
if(strcmp("-C",argv[i])==0)
	{
	strcpy(correct_filename,argv[i+1]);
	i+=2;
	}
else
if(strcmp("-T",argv[i])==0)
	{
	sscanf(argv[i+1],"%f",&tau);
	i+=2;
	THRESHOLD = TRUE;
	}
else
if(strcmp("-S",argv[i])==0)
	{
	strcpy(path2,argv[i+1]);
	WRITE_SMOOTH = TRUE;
	i+=2;
	}
else
if(strcmp("-B",argv[i])==0)
	{
	sscanf(argv[i+1],"%d",&pic_y);
	sscanf(argv[i+2],"%d",&pic_x);
	BINARY = TRUE;
	i += 3;
	}
else
	{
	printf("Invalid option %s specified as argument %d -  program terminates\n",argv[i],i);
	exit(1);
	}
}

if(WRITE_SMOOTH) printf("Smoothed data directory: %s\n",path2);
else printf("Smoothed images not written\n");
fflush(stdout);

printf("Correct velocity file: %s\n",correct_filename);
fflush(stdout);
if(strcmp(correct_filename,"unknown")!=0)
{
/* Read the correct velocity data */
if((fd_correct = open(correct_filename,O_RDONLY))<1)
	{
	printf("Fatal error in opening file %s\n",correct_filename);
	printf("fd_correct: %d\n",fd_correct);
	exit(1);
	}
no_bytes = 0;
no_bytes += read(fd_correct,&actual_y,4);
no_bytes += read(fd_correct,&actual_x,4);
no_bytes += read(fd_correct,&size_y,4);
no_bytes += read(fd_correct,&size_x,4);
no_bytes += read(fd_correct,&offset_y,4);
no_bytes += read(fd_correct,&offset_x,4);
if(offset_x != 0.0 || offset_y != 0.0 || actual_x != size_x || actual_y != size_y)
	{
	printf("Fatal error: something wrong with correct velocity data\n");
	printf("Actual y: %f Actual x: %f\n",actual_y,actual_x);
	printf("Size y: %f Size x: %f\n",size_y,size_x);
	printf("Offset y: %f Offset x: %f\n",offset_y,offset_x);
	exit(1);
	}
int_size_y = size_y;
int_size_x = size_x;
for(i=0;i<int_size_x;i++)
	no_bytes += read(fd_correct,&correct_vels[i][0][0],int_size_y*8);
printf("\nFile %s opened and read\n",correct_filename);
printf("Size of correct velocity data: %d %d\n",int_size_y,int_size_x);
printf("%d bytes read\n",no_bytes);
fflush(stdout);
}

if(!STANDARD)
{
size = 6*sigma+1;
if(size%2==0) size = size+1;
offset = size/2+2; /* Add 2 as neighbourhood size offset */
start = middle-offset;
end = middle+offset;
printf("Size: %d Offset: %d Start: %d End: %d\n",size,offset,start,end);
printf("%d images required\n",end-start+1);
if((end-start+1) > PIC_T)
	{
	printf("Fatal error: not enough room for the images\n");
	exit(1);
	}
if(end < start)
	{
	printf("Fatal error: specify images in ascending order\n");
	exit(1);
	}

read_and_smooth3D(path1,argv[1],sigma,floatpic,pic,inpic,start,middle,end,header);
if(sigma!=0.0 && WRITE_SMOOTH)
writefiles(path2,argv[1],pic,sigma,pic_t,pic_x,pic_y,middle-2,middle+2,header);
}
else
{
start = middle;
end = middle+1;
offset = 2;
readfiles(path1,argv[1],inpic,pic_t,&pic_x,&pic_y,start,end,header);
/* Copy the input images unchanged */
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	{
	pic[0][i][j] = inpic[0][i][j];
	pic[1][i][j] = inpic[1][i][j];
	pic[2][i][j] = 0;
	pic[3][i][j] = 0;
	pic[4][i][j] = 0;
	floatpic[0][i][j] = (int) inpic[0][i][j];
	floatpic[1][i][j] = (int) inpic[1][i][j];
	floatpic[2][i][j] = 0.0;
	floatpic[3][i][j] = 0.0;
	floatpic[4][i][j] = 0.0;
	}
}

printf("Number of Columns: %d Number of Rows: %d\n",pic_y,pic_x);
if(pic_x > PIC_X || pic_y > PIC_Y)
	{
	printf("Fatal error: images are too big\n");
	exit(1);
	}

printf("\n");
fflush(stdout);
if(STANDARD==TRUE)
{
if(THRESHOLD) sprintf(full_name,"%s/horn.original.%sF-%4.2f",path3,argv[1],tau);
else sprintf(full_name,"%s/horn.original.%sF",path3,argv[1]);
}
else
{
if(THRESHOLD) sprintf(full_name,"%s/horn.modified.%sF-%4.2f",path3,argv[1],tau);
else sprintf(full_name,"%s/horn.modified.%sF",path3,argv[1]);
}

printf("Output full velocities go to file %s\n",full_name);
printf("\n");
fflush(stdout);

startx = 0;
starty = 0;
endx = pic_x-1;
endy = pic_y-1;

startx += BORDER;
starty += BORDER;
endx -= BORDER;
endy -= BORDER;

step = 1;

time = 0;
if(STANDARD)
	{
	calcIx(Ix,floatpic,time);
	calcIy(Iy,floatpic,time);
	calcIt(It,floatpic,time);
	}
else compute_ders(Ix,Iy,It,floatpic,pic_t,pic_x,pic_y,offset);
if(FALSE)
{
if(STANDARD) printf("Standard Horn and Schunck Derivatives\n");
else printf("4 point central difference derivatives\n");
print_ders(Ix,Iy,It);
}

for(i=0;i<PIC_X;i++)
for(j=0;j<PIC_Y;j++)
	{
	full_vels[i][j][0] = full_vels[i][j][1] = 0.0;
	full_vels1[i][j][0] = full_vels1[i][j][1] = 0.0;
	}

/* Perform iterations */
for(i=0;i<numpass;i+=2)
	{
	printf("%3dth iteration\n",i);
	fflush(stdout);
	calc_vels(full_vels,full_vels1,Ix,Iy,It);
	printf("The improvement: %f\n",difference(full_vels,full_vels1,pic_x,pic_y));
	fflush(stdout);
if(strcmp(correct_filename,"unknown")!=0)
	{
	rearrange(full_vels1,temp_vels);
	calc_statistics(correct_vels,int_size_x,int_size_y,temp_vels,
     		pic_x,pic_y,2*offset,&ave_error,&st_dev,&density,&min_angle,&max_angle);
	printf("Error: %f St Dev: %f Density: %f\n",ave_error,st_dev,density);
	fflush(stdout);
	}
	printf("%3dth iteration\n",i+1);
	calc_vels(full_vels1,full_vels,Ix,Iy,It);
	printf("The improvement: %f\n",difference(full_vels,full_vels1,pic_x,pic_y));
if(strcmp(correct_filename,"unknown")!=0)
	{
	rearrange(full_vels,temp_vels);
	calc_statistics(correct_vels,int_size_x,int_size_y,temp_vels,
     		pic_x,pic_y,2*offset,&ave_error,&st_dev,&density,&min_angle,&max_angle);
	printf("Error: %f St Dev: %f Density: %f\n",ave_error,st_dev,density);
	fflush(stdout);
	}
	}
if(THRESHOLD) threshold(full_vels,Ix,Iy,tau,pic_x,pic_y);

if((fdf=creat(full_name,0644))>0)
	output_velocities(fdf,"Full",full_vels,pic_x,pic_y,2*offset);
else printf("Error in opening %s file\n\n",full_name);
printf("\nVelocities computed and output\n");
fflush(stdout);

if(strcmp(correct_filename,"unknown")!=0)
{
calc_statistics(correct_vels,int_size_x,int_size_y,full_vels,
     pic_x,pic_y,2*offset,&ave_error,&st_dev,&density,&min_angle,&max_angle);
printf("\n\nComputed Statistics\n");
printf("Error: %f St Dev: %f\n",ave_error,st_dev);
printf("Density: %f\n",density);
printf("Minimum angle error: %f Maximum angle error: %f\n",min_angle,max_angle);
}
fflush(stdout);
return EXIT_SUCCESS;
}